

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O0

void pltcalc::
     outputrows_splt<std::map<int,std::vector<period_occ_granular,std::allocator<period_occ_granular>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ_granular,std::allocator<period_occ_granular>>>>>,period_occ_granular>
               (summarySampleslevelHeader *sh,sampleslevelRec *sr,FILE *outFile,
               map<int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>_>_>
               *m_occ,vector<period_occ_granular,_std::allocator<period_occ_granular>_> *vp,
               OASIS_FLOAT impacted_exposure)

{
  ulong uVar1;
  bool bVar2;
  int strLen_00;
  mapped_type *__x;
  reference ppVar3;
  mapped_type *pmVar4;
  char local_1088 [4];
  int strLen;
  char buffer [4096];
  int local_80;
  int occ_minute;
  int occ_hour;
  int occ_day;
  int occ_month;
  int occ_year;
  period_occ_granular p;
  iterator __end0;
  iterator __begin0;
  vector<period_occ_granular,_std::allocator<period_occ_granular>_> *__range2;
  OASIS_FLOAT impacted_exposure_local;
  vector<period_occ_granular,_std::allocator<period_occ_granular>_> *vp_local;
  map<int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>_>_>
  *m_occ_local;
  FILE *outFile_local;
  sampleslevelRec *sr_local;
  summarySampleslevelHeader *sh_local;
  
  if (outFile != (FILE *)0x0) {
    __x = std::
          map<int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>_>_>
          ::operator[](m_occ,&sh->event_id);
    std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>::operator=(vp,__x);
    __end0 = std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>::begin(vp);
    p.occ_date_id =
         (longlong)std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>::end(vp);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<period_occ_granular_*,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>
                                       *)&p.occ_date_id), bVar2) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<period_occ_granular_*,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>
               ::operator*(&__end0);
      _occ_month = *(ulong *)ppVar3;
      p._0_8_ = ppVar3->occ_date_id;
      getdates<long_long>(p._0_8_,&occ_day,&occ_hour,&occ_minute,&local_80,(int *)(buffer + 0xffc));
      uVar1 = _occ_month;
      if (outFile != (FILE *)0x0) {
        pmVar4 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)period_weights_,&occ_month);
        strLen_00 = sprintf(local_1088,"%d,%f,%d,%d,%d,%d,%d,%d,%d,%d,%0.2f,%0.2f\n",*pmVar4,
                            (double)sr->loss,(double)impacted_exposure,uVar1 & 0xffffffff,
                            (ulong)(uint)sh->event_id,(ulong)(uint)occ_day,(ulong)(uint)occ_hour,
                            occ_minute,local_80,buffer._4092_4_,sh->summary_id,sr->sidx);
        writeoutput(local_1088,strLen_00,outFile);
      }
      __gnu_cxx::
      __normal_iterator<period_occ_granular_*,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>
      ::operator++(&__end0);
    }
  }
  return;
}

Assistant:

void outputrows_splt(const summarySampleslevelHeader& sh,
			     const sampleslevelRec &sr, FILE * outFile,
			     moccT &m_occ, std::vector<periodT> &vp,
			     const OASIS_FLOAT impacted_exposure)
	{
#ifdef HAVE_PARQUET
		if (outFile == nullptr && os_.find(OasisParquet::SPLT) == os_.end())
#else
		if (outFile == nullptr)
#endif
		{
			return;
		}

		vp = m_occ[sh.event_id];
		for (auto p : vp) {
			int occ_year, occ_month, occ_day, occ_hour, occ_minute;
			getdates(p.occ_date_id, occ_year, occ_month, occ_day,
				 occ_hour, occ_minute);
			
			if (outFile != nullptr) {
				char buffer[4096];
				int strLen;
				strLen = sprintf(buffer, "%d,%f,%d,%d,%d,%d,%d,"
						 "%d,%d,%d,%0.2f,%0.2f\n",
						 p.period_no,
						 period_weights_[p.period_no],
						 sh.event_id, occ_year,
						 occ_month, occ_day, occ_hour,
						 occ_minute, sh.summary_id,
						 sr.sidx, sr.loss,
						 impacted_exposure);
				writeoutput(buffer, strLen, outFile);
			}
#ifdef HAVE_PARQUET
			if (os_.find(OasisParquet::SPLT) != os_.end()) {
				os_[OasisParquet::SPLT] << p.period_no
							<< (float)period_weights_[p.period_no]
							<< sh.event_id
							<< occ_year << occ_month
							<< occ_day << occ_hour
							<< occ_minute
							<< sh.summary_id
							<< sr.sidx
							<< (float)sr.loss
							<< (float)impacted_exposure
							<< parquet::EndRow;
			}
#endif

		}
	}